

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O0

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)

{
  PFN_vkGetInstanceProcAddr in_RDI;
  
  vkGetInstanceProcAddr = in_RDI;
  volkGenLoadLoader(handler,(_func_PFN_vkVoidFunction_void_ptr_char_ptr *)in_RDI);
  return;
}

Assistant:

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)
{
	vkGetInstanceProcAddr = handler;

	volkGenLoadLoader(NULL, vkGetInstanceProcAddrStub);
}